

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall i2f::selector(i2f *this,context *ctx,token *token,opcode *op)

{
  char **table;
  uint64_t bits;
  string_view prefix;
  optional<unsigned_long> oVar1;
  token local_58;
  
  table = selector::bytes;
  if ((op->value & 0x1c00) == 0x400) {
    table = selector::shorts;
  }
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar1 = find_in_table(token,table,prefix);
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
  }
  bits = 0;
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    bits = oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload << 0x29;
  }
  opcode::add_bits(op,bits);
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(selector)
    {
        static const char* bytes[] = {"B0", "B1", "B2", "B3", nullptr};
        static const char* shorts[] = {"H0", "INVALIDSIZE1", "H1", "INVALIDSIZE3", nullptr};

        const uint64_t type = (op.value >> 10) & 0b111;
        const char* const* const table = type == 1 ? shorts : bytes;
        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(0) << 41);
        return {};
    }